

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImDrawList *this;
  ulong uVar1;
  ImGuiWindow *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ImDrawCmd *pIVar10;
  ImDrawVert *pIVar11;
  char *pcVar12;
  ImDrawCmd *pIVar13;
  unsigned_short *puVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  int local_1d4;
  ImGuiListClipper clipper;
  ImVec2 triangles_pos [3];
  ImVec2 local_170;
  char buf [300];
  undefined1 local_3c [12];
  
  pcVar17 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar17 = draw_list->_OwnerName;
  }
  bVar6 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar17,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,(draw_list->CmdBuffer).Size);
  pIVar5 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->DrawList == draw_list) {
    SameLine(0.0,-1.0);
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = -0x80;
    buf[3] = '?';
    buf[4] = -0x33;
    buf[5] = -0x34;
    buf[6] = -0x34;
    buf[7] = '>';
    buf[8] = -0x33;
    buf[9] = -0x34;
    buf[10] = -0x34;
    buf[0xb] = '>';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = -0x80;
    buf[0xf] = '?';
    TextColored((ImVec4 *)buf,"CURRENTLY APPENDING");
    if (!bVar6) {
      return;
    }
  }
  else {
    this = &pIVar5->ForegroundDrawList;
    if (window == (ImGuiWindow *)0x0) {
      if (!bVar6) {
        return;
      }
    }
    else {
      bVar7 = IsItemHovered(0);
      if (bVar7) {
        buf._0_4_ = (window->Size).x + (window->Pos).x;
        buf._4_4_ = (window->Size).y + (window->Pos).y;
        ImDrawList::AddRect(this,&window->Pos,(ImVec2 *)buf,0xff00ffff,0.0,0xf,1.0);
      }
      if (!bVar6) {
        return;
      }
      if (window->WasActive == false) {
        Text("(Note: owning Window is inactive: DrawList is not being rendered!)");
      }
    }
    pIVar10 = (draw_list->CmdBuffer).Data;
    local_1d4 = 0;
    for (pIVar13 = pIVar10; pIVar13 < pIVar10 + (draw_list->CmdBuffer).Size; pIVar13 = pIVar13 + 1)
    {
      if (pIVar13->UserCallback == (ImDrawCallback)0x0) {
        if (pIVar13->ElemCount != 0) {
          if ((draw_list->IdxBuffer).Size < 1) {
            puVar14 = (unsigned_short *)0x0;
          }
          else {
            puVar14 = (draw_list->IdxBuffer).Data;
          }
          ImFormatString(buf,300,
                         "Draw %4d triangles, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         SUB84((double)(pIVar13->ClipRect).x,0),(double)(pIVar13->ClipRect).y,
                         (double)(pIVar13->ClipRect).z,(double)(pIVar13->ClipRect).w,
                         (ulong)pIVar13->ElemCount / 3,pIVar13->TextureId);
          bVar6 = TreeNode((void *)(((long)pIVar13 - (long)(draw_list->CmdBuffer).Data) / 0x38),"%s"
                           ,buf);
          if ((show_drawcmd_clip_rects == true) && (bVar7 = IsItemHovered(0), bVar7)) {
            clipper.StartPosY = (pIVar13->ClipRect).x;
            clipper.ItemsHeight = (pIVar13->ClipRect).y;
            uVar3 = (pIVar13->ClipRect).z;
            uVar4 = (pIVar13->ClipRect).w;
            triangles_pos[0].x = 3.4028235e+38;
            triangles_pos[0].y = 3.4028235e+38;
            triangles_pos[1].x = -3.4028235e+38;
            triangles_pos[1].y = -3.4028235e+38;
            clipper.ItemsCount = uVar3;
            clipper.StepNo = uVar4;
            for (lVar18 = (long)local_1d4; lVar18 < (long)(int)pIVar13->ElemCount + (long)local_1d4;
                lVar18 = lVar18 + 1) {
              if (puVar14 == (unsigned_short *)0x0) {
                uVar15 = (uint)lVar18;
              }
              else {
                uVar15 = (uint)puVar14[lVar18];
              }
              pIVar11 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,uVar15);
              ImRect::Add((ImRect *)triangles_pos,&pIVar11->pos);
            }
            ImRect::Floor((ImRect *)&clipper);
            ImDrawList::AddRect(this,(ImVec2 *)&clipper,(ImVec2 *)&clipper.ItemsCount,0xffff00ff,0.0
                                ,0xf,1.0);
            ImRect::Floor((ImRect *)triangles_pos);
            ImDrawList::AddRect(this,triangles_pos,triangles_pos + 1,0xff00ffff,0.0,0xf,1.0);
          }
          if (bVar6) {
            Text("ElemCount: %d, ElemCount/3: %d, VtxOffset: +%d, IdxOffset: +%d",
                 (ulong)pIVar13->ElemCount,(ulong)pIVar13->ElemCount / 3,(ulong)pIVar13->VtxOffset,
                 (ulong)pIVar13->IdxOffset);
            clipper.ItemsCount = pIVar13->ElemCount / 3;
            clipper.ItemsHeight = -1.0;
            clipper.StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
            clipper.StepNo = 0;
            clipper.DisplayStart = -1;
            clipper.DisplayEnd = -1;
            while (bVar6 = ImGuiListClipper::Step(&clipper), bVar6) {
              uVar16 = (ulong)(uint)(clipper.DisplayStart * 3 + local_1d4);
              for (iVar9 = clipper.DisplayStart; iVar9 < clipper.DisplayEnd; iVar9 = iVar9 + 1) {
                triangles_pos[0].x = 0.0;
                triangles_pos[0].y = 0.0;
                triangles_pos[1].x = 0.0;
                triangles_pos[1].y = 0.0;
                triangles_pos[2].x = 0.0;
                triangles_pos[2].y = 0.0;
                pcVar17 = buf;
                for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
                  uVar1 = (uVar16 & 0xffffffff) + lVar18;
                  if (puVar14 == (unsigned_short *)0x0) {
                    uVar15 = (uint)uVar1;
                  }
                  else {
                    uVar15 = (uint)puVar14[(int)uVar16 + lVar18];
                  }
                  pIVar11 = ImVector<ImDrawVert>::operator[](&draw_list->VtxBuffer,uVar15);
                  triangles_pos[lVar18] = pIVar11->pos;
                  pcVar12 = "    ";
                  if (lVar18 == 0) {
                    pcVar12 = "elem";
                  }
                  iVar8 = ImFormatString(pcVar17,(size_t)(local_3c + -(long)pcVar17),
                                         "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                         SUB84((double)(pIVar11->pos).x,0),(double)(pIVar11->pos).y,
                                         (double)(pIVar11->uv).x,(double)(pIVar11->uv).y,pcVar12,
                                         uVar1 & 0xffffffff,(ulong)pIVar11->col);
                  pcVar17 = pcVar17 + iVar8;
                }
                local_170.x = 0.0;
                local_170.y = 0.0;
                Selectable(buf,false,0,&local_170);
                bVar6 = IsItemHovered(0);
                if (bVar6) {
                  uVar15 = (pIVar5->ForegroundDrawList).Flags;
                  (pIVar5->ForegroundDrawList).Flags = uVar15 & 0xfffffffe;
                  ImDrawList::AddPolyline(this,triangles_pos,3,0xff00ffff,true,1.0);
                  (pIVar5->ForegroundDrawList).Flags = uVar15;
                }
                uVar16 = (uVar16 & 0xffffffff) + 3;
              }
            }
            TreePop();
            ImGuiListClipper::~ImGuiListClipper(&clipper);
          }
        }
      }
      else {
        BulletText("Callback %p, user_data %p",pIVar13->UserCallback,pIVar13->UserCallbackData);
      }
      local_1d4 = local_1d4 + pIVar13->ElemCount;
      pIVar10 = (draw_list->CmdBuffer).Data;
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f,0.4f,0.4f,1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::Text("(Note: owning Window is inactive: DrawList is not being rendered!)");

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Draw %4d triangles, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount/3, (void*)(intptr_t)pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (show_drawcmd_clip_rects && fg_draw_list && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); fg_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,0,255,255));
                    vtxs_rect.Floor(); fg_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,255,0,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGui::Text("ElemCount: %d, ElemCount/3: %d, VtxOffset: +%d, IdxOffset: +%d", pcmd->ElemCount, pcmd->ElemCount/3, pcmd->VtxOffset, pcmd->IdxOffset);
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            int vtx_i = idx_buffer ? idx_buffer[idx_i] : idx_i;
                            ImDrawVert& v = draw_list->VtxBuffer[vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "elem" : "    ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }